

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::IDDatatypeValidator::checkValueSpace
          (IDDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  bool bVar1;
  XMLSize_t count;
  InvalidDatatypeValueException *this_00;
  
  count = XMLString::stringLen(content);
  bVar1 = XMLChar1_0::isValidNCName(content,count);
  if (bVar1) {
    return;
  }
  this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
  InvalidDatatypeValueException::InvalidDatatypeValueException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/IDDatatypeValidator.cpp"
             ,0x67,VALUE_Invalid_NCName,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
  __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
}

Assistant:

void IDDatatypeValidator::checkValueSpace(const XMLCh* const content
                                          , MemoryManager* const manager)
{
    //
    // 3.3.8 check must: "NCName"
    //
    if ( !XMLChar1_0::isValidNCName(content, XMLString::stringLen(content)) )
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                , XMLExcepts::VALUE_Invalid_NCName
                , content
                , manager);
    }

}